

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_object.cpp
# Opt level: O3

object_ptr __thiscall mjs::new_number(mjs *this,object_ptr *prototype,double val)

{
  gc_heap *num_bytes;
  undefined8 extraout_RDX;
  object_ptr oVar1;
  gc_heap_ptr<mjs::number_object> o;
  undefined1 local_50 [32];
  double local_30;
  
  num_bytes = (prototype->super_gc_heap_ptr_untyped).heap_;
  local_30 = val;
  gc_heap_ptr_untyped::get(&prototype->super_gc_heap_ptr_untyped);
  object::class_name((object *)(local_50 + 0x10));
  gc_heap::
  allocate_and_construct<mjs::number_object,mjs::string,mjs::gc_heap_ptr<mjs::object>const&,double&>
            ((gc_heap *)local_50,(size_t)num_bytes,(string *)0x28,
             (gc_heap_ptr<mjs::object> *)(local_50 + 0x10),(double *)prototype);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_50 + 0x10));
  *(undefined8 *)this = local_50._0_8_;
  *(undefined4 *)(this + 8) = local_50._8_4_;
  if ((gc_heap *)local_50._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_50._0_8_,(gc_heap_ptr_untyped *)this);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_50);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr new_number(const object_ptr& prototype,  double val) {
    auto o = prototype.heap().make<number_object>(prototype->class_name(), prototype, val);
    return o;
}